

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O3

DataHeader *
pointerTOCLookupFn(UDataMemory *pData,char *name,int32_t *pLength,UErrorCode *pErrorCode)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  int *piVar4;
  DataHeader *pDVar5;
  long *plVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  piVar4 = (int *)pData->toc;
  if (piVar4 == (int *)0x0) {
    pDVar5 = pData->pHeader;
  }
  else {
    iVar13 = *piVar4;
    if ((long)iVar13 != 0) {
      plVar6 = (long *)(piVar4 + 2);
      uVar10 = 0;
      do {
        uVar9 = uVar10;
        cVar1 = name[uVar9];
        if (cVar1 == '\0') break;
        uVar10 = uVar9 + 1;
      } while (cVar1 == *(char *)(*plVar6 + uVar9));
      uVar10 = 0;
      if (cVar1 == *(char *)(*plVar6 + uVar9)) {
LAB_00306edd:
        *pLength = -1;
        pDVar5 = UDataMemory_normalizeDataPointer_63
                           (*(void **)(piVar4 + (uVar10 & 0xffffffff) * 4 + 4));
        return pDVar5;
      }
      uVar10 = (long)iVar13 - 1;
      uVar11 = 0;
      do {
        uVar12 = uVar11;
        cVar1 = name[uVar12];
        if (cVar1 == '\0') break;
        uVar11 = uVar12 + 1;
      } while (cVar1 == *(char *)(plVar6[uVar10 * 2] + uVar12));
      if (cVar1 == *(char *)(plVar6[uVar10 * 2] + uVar12)) {
        if (0 < iVar13) goto LAB_00306edd;
      }
      else if (2 < iVar13) {
        iVar13 = 1;
        uVar11 = uVar10;
        do {
          uVar14 = (uint)((int)uVar11 + iVar13) >> 1;
          uVar10 = (ulong)uVar14;
          iVar7 = (int)uVar12;
          if ((int)uVar9 < (int)uVar12) {
            iVar7 = (int)uVar9;
          }
          lVar15 = 0;
          do {
            bVar2 = name[lVar15 + iVar7];
            bVar3 = *(byte *)((long)iVar7 + plVar6[uVar10 * 2] + lVar15);
            lVar15 = lVar15 + 1;
            if (bVar2 == 0) break;
          } while (bVar2 == bVar3);
          uVar8 = (ulong)(iVar7 - 1) + lVar15;
          if (bVar2 < bVar3) {
            uVar12 = uVar8 & 0xffffffff;
            uVar11 = uVar10;
          }
          else {
            if (bVar2 == bVar3) goto LAB_00306edd;
            iVar13 = uVar14 + 1;
            uVar9 = uVar8 & 0xffffffff;
            uVar11 = uVar11 & 0xffffffff;
          }
          if ((int)uVar11 <= iVar13) {
            return (DataHeader *)0x0;
          }
        } while( true );
      }
    }
    pDVar5 = (DataHeader *)0x0;
  }
  return pDVar5;
}

Assistant:

static const DataHeader * U_CALLCONV pointerTOCLookupFn(const UDataMemory *pData,
                   const char *name,
                   int32_t *pLength,
                   UErrorCode *pErrorCode) {
    (void)pErrorCode;
    if(pData->toc!=NULL) {
        const PointerTOC *toc = (PointerTOC *)pData->toc;
        int32_t number, count=(int32_t)toc->count;

#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, toc->entry[number].entryName);
        }
#endif
        number=pointerTOCPrefixBinarySearch(name, toc->entry, count);
        if(number>=0) {
            /* found it */
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", toc->entry[number].entryName);
#endif
            *pLength=-1;
            return UDataMemory_normalizeDataPointer(toc->entry[number].pHeader);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", name);
#endif
            return NULL;
        }
    } else {
        return pData->pHeader;
    }
}